

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  ulong uVar1;
  Instruction *pIVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ravi_type_map type;
  TString *usertype;
  ravi_type_map local_3c;
  TString *local_38;
  
  pcVar5 = luaF_getlocalname(p,reg + 1,lastpc,&local_3c,&local_38);
  *name = pcVar5;
  if (pcVar5 != (char *)0x0) {
    return "local";
  }
  uVar6 = 0;
  if (lastpc < 1) {
    return (char *)0x0;
  }
  pIVar2 = p->code;
  uVar8 = 0xffffffff;
  uVar9 = 0;
  do {
    uVar7 = pIVar2[uVar9];
    uVar10 = uVar7 >> 8 & 0x7f;
    uVar12 = uVar7 & 0xff;
    if (uVar12 < 0x24) {
      if (uVar12 == 4) {
        if (((int)uVar10 <= reg) && ((uint)reg <= uVar10 + (uVar7 >> 0x18))) goto LAB_0012af56;
      }
      else {
        if (uVar12 != 0x1e) goto LAB_0012af43;
        uVar1 = (uVar9 - 0x7fff) + (ulong)(uVar7 >> 0x10);
        iVar4 = (int)uVar1;
        uVar11 = uVar6;
        if ((int)uVar6 < iVar4) {
          uVar11 = uVar1 & 0xffffffff;
        }
        if ((long)iVar4 <= (long)uVar9) {
          uVar11 = uVar6;
        }
        if (iVar4 <= lastpc) {
          uVar6 = uVar11;
        }
      }
    }
    else {
      if (1 < uVar12 - 0x24) {
        if (uVar12 != 0x29) {
LAB_0012af43:
          if ((uVar10 == reg) && ((luaP_opmodes[uVar7 & 0xff] & 0x40) != 0)) goto LAB_0012af56;
          goto LAB_0012af62;
        }
        uVar10 = uVar10 + 2;
      }
      if ((int)uVar10 <= reg) {
LAB_0012af56:
        uVar8 = uVar9 & 0xffffffff;
        if ((long)uVar9 < (long)(int)uVar6) {
          uVar8 = 0xffffffff;
        }
      }
    }
LAB_0012af62:
    uVar9 = uVar9 + 1;
  } while ((uint)lastpc != uVar9);
  iVar4 = (int)uVar8;
  if (iVar4 == -1) {
    return (char *)0x0;
  }
  uVar7 = pIVar2[iVar4];
  uVar10 = uVar7 & 0xff;
  uVar6 = (ulong)(uVar10 - 0x4b);
  if (uVar10 - 0x4b < 0x29) {
    if ((0x12900000060U >> (uVar6 & 0x3f) & 1) != 0) {
switchD_0012affa_caseD_6:
      uVar12 = uVar7 >> 0x10 & 0xff;
      if (((char)uVar7 == 's') || (uVar10 == 6)) {
        pcVar5 = upvalname(p,uVar7 >> 0x18);
        kname(p,iVar4,uVar12,name);
      }
      else {
        pcVar5 = luaF_getlocalname(p,(uVar7 >> 0x18) + 1,iVar4,&local_3c,&local_38);
        kname(p,iVar4,uVar12,name);
        if (pcVar5 == (char *)0x0) {
          return "field";
        }
      }
      iVar4 = strcmp(pcVar5,"_ENV");
      if (iVar4 == 0) {
        return "global";
      }
      return "field";
    }
    if ((0x1fUL >> (uVar6 & 0x3f) & 1) != 0) goto switchD_0012affa_caseD_0;
    if ((0x4400000000U >> (uVar6 & 0x3f) & 1) != 0) goto switchD_0012affa_caseD_c;
  }
  switch(uVar10) {
  case 0:
switchD_0012affa_caseD_0:
    if ((uVar7 >> 8 & 0x7f) <= uVar7 >> 0x18) {
      return (char *)0x0;
    }
    pcVar5 = getobjname(p,iVar4,uVar7 >> 0x18,name);
    return pcVar5;
  case 1:
  case 2:
    if ((char)uVar7 == '\x01') {
      uVar7 = uVar7 >> 0x10;
    }
    else {
      uVar7 = pIVar2[(long)iVar4 + 1] >> 8;
    }
    if ((*(ushort *)((long)&p->k->tt_ + (ulong)(uVar7 << 4)) & 0xf) != 4) {
      return (char *)0x0;
    }
    lVar3 = *(long *)((long)&p->k->value_ + (ulong)(uVar7 << 4));
    if ((*(byte *)(lVar3 + 8) & 0xf) != 4) {
      __assert_fail("(((((&p->k[b])->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x1f9,"const char *getobjname(Proto *, int, int, const char **)");
    }
    *name = (char *)(lVar3 + 0x18);
    return "constant";
  default:
    return (char *)0x0;
  case 5:
    pcVar5 = upvalname(p,uVar7 >> 0x18);
    *name = pcVar5;
    return "upvalue";
  case 6:
  case 7:
    goto switchD_0012affa_caseD_6;
  case 0xc:
switchD_0012affa_caseD_c:
    kname(p,iVar4,uVar7 >> 0x10 & 0xff,name);
    return "method";
  }
}

Assistant:

static const char *getobjname (Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  ravi_type_map type;
  TString *usertype;
  *name = luaF_getlocalname(p, reg + 1, lastpc, &type, &usertype);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_RAVI_MOVEI:
      case OP_RAVI_MOVEF:
      case OP_RAVI_MOVEFARRAY:
      case OP_RAVI_MOVEIARRAY:
      case OP_RAVI_MOVETAB:
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_RAVI_GETI:
      case OP_RAVI_TABLE_GETFIELD:
      case OP_RAVI_GETFIELD:
      case OP_RAVI_IARRAY_GET:
      case OP_RAVI_FARRAY_GET:
      case OP_GETTABUP:
      case OP_RAVI_GETTABUP_SK:
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        int t = GETARG_B(i);  /* table index */
        const char *vn = (op != OP_GETTABUP && op != OP_RAVI_GETTABUP_SK)  /* name of indexed variable */
                         ? luaF_getlocalname(p, t + 1, pc, &type, &usertype)  /* t+1 is the local variable number */
                         : upvalname(p, t);
        kname(p, pc, k, name);
        return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_RAVI_SELF_SK:
      case OP_RAVI_TABLE_SELF_SK:
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, pc, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}